

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::addRenameCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  mapped_type *this_00;
  char *__s;
  size_t __n_00;
  ulong uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __n;
  string_view fmt;
  format_args args;
  key_type local_58;
  size_t sVar4;
  
  __s = value._M_str;
  __n_00 = value._M_len;
  uVar5 = 0xffffffffffffffff;
  if (__n_00 == 0) {
LAB_001c11b6:
    uVar3 = 0xffffffffffffffff;
  }
  else {
    pvVar2 = memchr(__s,0x2c,__n_00);
    uVar5 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
    sVar4 = __n_00;
    do {
      uVar3 = sVar4 - 1;
      if (sVar4 == 0) goto LAB_001c11b6;
      lVar1 = sVar4 - 1;
      sVar4 = uVar3;
    } while (__s[lVar1] != ',');
  }
  if (uVar5 == 0xffffffffffffffff || uVar5 != uVar3) {
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    local_58._M_dataplus._M_p = __s;
    local_58._M_string_length = __n_00;
    ::fmt::v11::vformat_abi_cxx11_
              (__return_storage_ptr__,(v11 *)"missing or extra comma in argument \'{}\'",fmt,args);
  }
  else {
    lVar1 = uVar5 + 1;
    if (__n_00 <= uVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,__n_00);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + uVar5);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->cmdRename,&local_58);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this_00,0,this_00->_M_string_length,__s + lVar1,__n_00 - lVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addRenameCommand(std::string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == std::string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const std::string_view slangName = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);
    cmdRename[std::string(value)] = slangName;
    return {};
}